

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::OctoquadIdentifier::SetTrigramAlphabet
          (OctoquadIdentifier *this,ScriptContext *scriptContext,char *alpha,char *alphaBits)

{
  char cVar1;
  TrigramAlphabet *this_00;
  uint i;
  long lVar2;
  
  lVar2 = 0;
  this_00 = (TrigramAlphabet *)
            new<Memory::ArenaAllocator>(0x3378,&scriptContext->regexAllocator,0x364470);
  builtin_strncpy(this_00->alphaBits,
                  "\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04"
                  ,0x80);
  do {
    cVar1 = alpha[lVar2];
    this_00->alpha[lVar2] = cVar1;
    this_00->alphaBits[cVar1] = alphaBits[cVar1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  TrigramAlphabet::InitTrigramMap(this_00);
  Js::ScriptContext::SetTrigramAlphabet(scriptContext,this_00);
  return;
}

Assistant:

void OctoquadIdentifier::SetTrigramAlphabet(Js::ScriptContext * scriptContext,
        __in_xcount(regex::TrigramAlphabet::AlphaCount) char* alpha
        , __in_xcount(regex::TrigramAlphabet::AsciiTableSize) char* alphaBits)
    {
        ArenaAllocator* alloc = scriptContext->RegexAllocator();
        TrigramAlphabet * trigramAlphabet = AnewStruct(alloc, UnifiedRegex::TrigramAlphabet);
        for (uint i = 0; i < UnifiedRegex::TrigramAlphabet::AsciiTableSize; i++) {
            trigramAlphabet->alphaBits[i] = UnifiedRegex::TrigramAlphabet::BitsNotInAlpha;
        }
        for (uint i = 0; i < UnifiedRegex::TrigramAlphabet::AlphaCount; i++) {
            trigramAlphabet->alpha[i] = alpha[i];
            trigramAlphabet->alphaBits[alpha[i]] = alphaBits[alpha[i]];
        }
        trigramAlphabet->InitTrigramMap();
        scriptContext->SetTrigramAlphabet(trigramAlphabet);
    }